

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall RangeLock_ErrorWithLockHeld_Test::TestBody(RangeLock_ErrorWithLockHeld_Test *this)

{
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *this_01;
  undefined8 *puVar1;
  undefined1 local_4c8 [32];
  ReturnAction<bool> local_4a8;
  MatcherBase<unsigned_long> local_498;
  range_lock lock;
  MatcherBase<pstore::file::file_base::blocking_mode> local_418;
  MatcherBase<pstore::file::file_base::lock_kind> local_400;
  MatcherBase<unsigned_long> local_3e8;
  mock_file file;
  
  anon_unknown.dwarf_146a0::mock_file::mock_file(&file);
  local_498.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_498.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ca360;
  local_3e8.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_3e8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ca360;
  local_400.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::
       GetVTable<testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_400.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ca8d0;
  local_418.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::
       GetVTable<testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_418.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ca970;
  anon_unknown.dwarf_146a0::mock_file::gmock_lock
            ((MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              *)&lock,&file,(Matcher<unsigned_long> *)&local_498,
             (Matcher<unsigned_long> *)&local_3e8,
             (Matcher<pstore::file::file_base::lock_kind> *)&local_400,
             (Matcher<pstore::file::file_base::blocking_mode> *)&local_418);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::InternalExpectedAt
                      ((MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                        *)&lock,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x13f,"file","lock (_, _, _, _)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_4a8,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              *)local_4c8,(ReturnAction *)&local_4a8);
  testing::internal::
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::WillOnce(this_00,(Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                      *)local_4c8);
  std::_Function_base::~_Function_base((_Function_base *)local_4c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a8.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                  *)&lock.offset_);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase(&local_418);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase(&local_400);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_3e8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_498);
  local_4c8._8_8_ =
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_4c8._0_8_ = &PTR__MatcherBase_001ca360;
  local_498.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_498.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ca360;
  anon_unknown.dwarf_146a0::mock_file::gmock_unlock
            ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&lock,&file,
             (Matcher<unsigned_long> *)local_4c8,(Matcher<unsigned_long> *)&local_498);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                      ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&lock,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x140,"file","unlock (_, _)");
  testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(this_01,1);
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>_>
                *)&lock.offset_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_498);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_4c8);
  pstore::file::range_lock::range_lock(&lock,&file.super_file_base,5,7,exclusive_write);
  pstore::file::range_lock::lock(&lock);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_001c9bc0;
  __cxa_throw(puVar1,&TestBody()::custom_exception::typeinfo,std::exception::~exception);
}

Assistant:

TEST (RangeLock, ErrorWithLockHeld) {
    mock_file file;

    using ::testing::_;
    EXPECT_CALL (file, lock (_, _, _, _)).WillOnce (::testing::Return (true));
    EXPECT_CALL (file, unlock (_, _)).Times (1);

    class custom_exception : public std::exception {};

    try {
        constexpr auto offset = std::uint64_t{5};
        constexpr auto size = std::size_t{7};
        pstore::file::range_lock lock (&file, offset, size, mock_file::lock_kind::exclusive_write);
        lock.lock ();
        // Throw with the lock held.
        throw custom_exception{};
    } catch (custom_exception const &) {
    } catch (...) {
        GTEST_FAIL () << "An unexpected exception was raised.";
    }
}